

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseModule(Parser *this)

{
  Token *pTVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  Parser *in_RSI;
  undefined1 local_a0 [14];
  undefined2 local_92;
  Token *tokId;
  undefined1 local_88 [24];
  ModBody body;
  
  sanityExpect(in_RSI,TOK_KW_MOD);
  pTVar1 = in_RSI->lexer->currentToken;
  tokId = pTVar1;
  bVar3 = expect(in_RSI,TOK_ID);
  if (!bVar3) {
    local_a0[8] = true;
    local_a0[9] = false;
    local_a0._0_4_ = 8;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&body,(SyntaxErrorCode *)(local_a0 + 8),(Position *)local_a0);
    generateError((Parser *)(local_88 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_88 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&body);
  }
  bVar4 = expect(in_RSI,TOK_EOL);
  if (!bVar4) {
    local_a0[8] = true;
    local_a0[9] = false;
    local_a0._0_4_ = 0xf;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&body,(SyntaxErrorCode *)(local_a0 + 8),(Position *)local_a0);
    generateError((Parser *)(local_88 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_88 + 8));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&body);
  }
  parseModBody(&body,in_RSI,false);
  bVar4 = expect(in_RSI,TOK_STMT);
  if (!bVar4) {
    local_92 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_a0._8_4_ = 0xc;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)local_a0,(SyntaxErrorCode *)&local_92,(Position *)(local_a0 + 8));
    generateError((Parser *)local_88,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_88)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)local_a0);
  }
  if (bVar3) {
    std::
    make_unique<pfederc::ModExpr,pfederc::Lexer&,pfederc::Position_const&,pfederc::Token_const*&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
              ((Lexer *)local_a0,(Position *)in_RSI->lexer,(Token **)&pTVar1->pos,
               (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&tokId);
    uVar2 = local_a0._0_8_;
    local_a0._0_8_ =
         (_Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          )0x0;
    this->lexer = (Lexer *)uVar2;
    std::unique_ptr<pfederc::ModExpr,_std::default_delete<pfederc::ModExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ModExpr,_std::default_delete<pfederc::ModExpr>_> *)local_a0);
  }
  else {
    this->lexer = (Lexer *)0x0;
  }
  std::
  _Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
  ::~_Tuple_impl((_Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
                  *)&body);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseModule() noexcept {
  sanityExpect(TokenType::TOK_KW_MOD);
  
  bool err = false;

  const Token *tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    // soft error
  }

  ModBody body = parseModBody();
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    // soft error
  }

  if (err)
    return nullptr;
 
  return std::make_unique<ModExpr>(lexer, tokId->getPosition(), tokId,
    std::move(std::get<2>(body)));
}